

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O0

void __thiscall Assimp::glTF2Importer::ImportMeshes(glTF2Importer *this,Asset *r)

{
  int iVar1;
  int b;
  long lVar2;
  pointer pRVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  size_t sVar16;
  bool bVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  size_type sVar21;
  aiMesh *this_00;
  ulong uVar22;
  reference pvVar23;
  aiVector3t<float> *paVar24;
  size_t *psVar25;
  Logger *pLVar26;
  void *pvVar27;
  aiAnimMesh *paVar28;
  aiAnimMesh *paVar29;
  Accessor *pAVar30;
  undefined8 *puVar31;
  reference pvVar32;
  ulong *puVar33;
  ulong uVar34;
  aiVector3t<float> aVar35;
  aiFace *local_788;
  aiFace *local_758;
  aiFace *local_728;
  aiFace *local_6f8;
  aiFace *local_6c8;
  aiFace *local_698;
  aiFace *local_630;
  aiFace *local_5d0;
  aiFace *local_588;
  aiFace *local_530;
  aiFace *local_4e8;
  aiFace *local_4a8;
  aiVector3t<float> *local_310;
  aiVector3t<float> *local_2e8;
  string *local_290;
  uint local_25c;
  uint local_258;
  uint i_14;
  uint i_13;
  uint i_12;
  uint i_11;
  uint i_10;
  uint i_9;
  uint count_1;
  uint i_8;
  uint i_7;
  uint i_6;
  uint i_5;
  uint i_4;
  uint i_3;
  Indexer data;
  size_t count;
  size_t nFaces;
  aiFace *faces;
  aiVector3t<float> local_1d0;
  undefined8 local_1c0;
  float local_1b8;
  uint local_1b4;
  aiVector3t<float> *paStack_1b0;
  uint vertexId_2;
  aiVector3D *tangentDiff;
  Tangent *tangent;
  aiVector3t<float> *paStack_198;
  uint vertexId_1;
  aiVector3D *normalDiff;
  aiVector3t<float> *paStack_188;
  uint vertexId;
  aiVector3D *positionDiff;
  Target *target;
  aiAnimMesh *aiAnimMesh;
  size_t i_2;
  vector<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_> *targets;
  long lStack_158;
  uint i_1;
  aiVector3D *values;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  ulong local_110;
  size_t tc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  ulong local_c8;
  size_t c;
  float local_b8;
  aiVector3t<float> local_b0;
  aiVector3t<float> local_a0;
  size_t local_90;
  float local_88;
  uint local_84;
  Tangent *pTStack_80;
  uint i;
  Tangent *tangents;
  Attributes *attr;
  ai_uint32 *len;
  aiMesh *aim;
  Primitive *prim;
  Mesh *pMStack_50;
  uint p;
  Mesh *mesh;
  uint local_38;
  value_type_conflict2 local_34;
  uint m;
  uint k;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  Asset *r_local;
  glTF2Importer *this_local;
  
  meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)r;
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&m);
  local_34 = 0;
  local_38 = 0;
  do {
    uVar19 = local_38;
    uVar18 = glTF2::LazyDict<glTF2::Mesh>::Size
                       ((LazyDict<glTF2::Mesh> *)
                        (meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 200));
    if (uVar18 <= uVar19) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->meshOffsets,&local_34);
      BaseImporter::CopyVector<aiMesh*>
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&m,&this->mScene->mMeshes,
                 &this->mScene->mNumMeshes);
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&m);
      return;
    }
    pMStack_50 = glTF2::LazyDict<glTF2::Mesh>::operator[]
                           ((LazyDict<glTF2::Mesh> *)
                            (meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 200),(ulong)local_38);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->meshOffsets,&local_34);
    sVar21 = std::vector<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>::size
                       (&pMStack_50->primitives);
    local_34 = (int)sVar21 + local_34;
    for (prim._4_4_ = 0; uVar22 = (ulong)prim._4_4_,
        sVar21 = std::vector<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>::size
                           (&pMStack_50->primitives), uVar22 < sVar21; prim._4_4_ = prim._4_4_ + 1)
    {
      aim = (aiMesh *)
            std::vector<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>::operator[]
                      (&pMStack_50->primitives,(ulong)prim._4_4_);
      this_00 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(this_00);
      len = (ai_uint32 *)this_00;
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&m,(value_type *)&len);
      uVar22 = std::__cxx11::string::empty();
      if ((uVar22 & 1) == 0) {
        local_290 = &(pMStack_50->super_Object).name;
      }
      else {
        local_290 = &(pMStack_50->super_Object).id;
      }
      aiString::operator=((aiString *)(len + 0x3b),local_290);
      sVar21 = std::vector<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>::size
                         (&pMStack_50->primitives);
      if (1 < sVar21) {
        attr = (Attributes *)(len + 0x3b);
        *(undefined1 *)
         ((long)len +
         (ulong)*(uint *)&(attr->position).
                          super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0xf0) = 0x2d;
        uVar19 = *(uint *)&(attr->position).
                           super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
        uVar19 = ASSIMP_itoa10((char *)((long)len + (ulong)uVar19 + 0xf1),0x3ff - uVar19,prim._4_4_)
        ;
        *(uint *)&(attr->position).
                  super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
             uVar19 + 1 +
             *(int *)&(attr->position).
                      super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
      }
      uVar19 = aim->mPrimitiveTypes;
      if (uVar19 == 0) {
        *len = *len | 1;
      }
      else if (uVar19 - 1 < 3) {
        *len = *len | 2;
      }
      else if (uVar19 - 4 < 3) {
        *len = *len | 4;
      }
      tangents = (Tangent *)&aim->mNumFaces;
      sVar21 = std::
               vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>::
               size((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                     *)tangents);
      if (sVar21 != 0) {
        pvVar23 = std::
                  vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                  ::operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                *)tangents,0);
        bVar17 = glTF2::Ref::operator_cast_to_bool((Ref *)pvVar23);
        if (bVar17) {
          pvVar23 = std::
                    vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                    ::operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                  *)tangents,0);
          pAVar30 = glTF2::Ref<glTF2::Accessor>::operator->(pvVar23);
          len[1] = (ai_uint32)pAVar30->count;
          pvVar23 = std::
                    vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                    ::operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                  *)tangents,0);
          pAVar30 = glTF2::Ref<glTF2::Accessor>::operator->(pvVar23);
          glTF2::Accessor::ExtractData<aiVector3t<float>>(pAVar30,(aiVector3t<float> **)(len + 4));
        }
      }
      sVar21 = std::
               vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>::
               size((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                     *)&tangents[1].xyz.z);
      if (sVar21 != 0) {
        pvVar23 = std::
                  vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                  ::operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                *)&tangents[1].xyz.z,0);
        bVar17 = glTF2::Ref::operator_cast_to_bool((Ref *)pvVar23);
        if (bVar17) {
          pvVar23 = std::
                    vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                    ::operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                  *)&tangents[1].xyz.z,0);
          pAVar30 = glTF2::Ref<glTF2::Accessor>::operator->(pvVar23);
          glTF2::Accessor::ExtractData<aiVector3t<float>>(pAVar30,(aiVector3t<float> **)(len + 6));
          sVar21 = std::
                   vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                   ::size((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                           *)(tangents + 3));
          if (sVar21 != 0) {
            pvVar23 = std::
                      vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                      ::operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                    *)(tangents + 3),0);
            bVar17 = glTF2::Ref::operator_cast_to_bool((Ref *)pvVar23);
            if (bVar17) {
              pTStack_80 = (Tangent *)0x0;
              pvVar23 = std::
                        vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                        ::operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                      *)(tangents + 3),0);
              pAVar30 = glTF2::Ref<glTF2::Accessor>::operator->(pvVar23);
              glTF2::Accessor::ExtractData<(anonymous_namespace)::Tangent>
                        (pAVar30,&stack0xffffffffffffff80);
              uVar22 = (ulong)len[1];
              paVar24 = (aiVector3t<float> *)operator_new__(uVar22 * 0xc);
              if (uVar22 != 0) {
                local_2e8 = paVar24;
                do {
                  aiVector3t<float>::aiVector3t(local_2e8);
                  local_2e8 = local_2e8 + 1;
                } while (local_2e8 != paVar24 + uVar22);
              }
              *(aiVector3t<float> **)(len + 8) = paVar24;
              uVar22 = (ulong)len[1];
              paVar24 = (aiVector3t<float> *)operator_new__(uVar22 * 0xc);
              if (uVar22 != 0) {
                local_310 = paVar24;
                do {
                  aiVector3t<float>::aiVector3t(local_310);
                  local_310 = local_310 + 1;
                } while (local_310 != paVar24 + uVar22);
              }
              *(aiVector3t<float> **)(len + 10) = paVar24;
              for (local_84 = 0; local_84 < len[1]; local_84 = local_84 + 1) {
                uVar22 = (ulong)local_84;
                lVar2 = *(long *)(len + 8);
                *(float *)(lVar2 + 8 + uVar22 * 0xc) = pTStack_80[uVar22].xyz.z;
                *(undefined8 *)(lVar2 + uVar22 * 0xc) = *(undefined8 *)&pTStack_80[uVar22].xyz;
                aVar35 = operator^((aiVector3t<float> *)(*(long *)(len + 6) + (ulong)local_84 * 0xc)
                                   ,&pTStack_80[local_84].xyz);
                local_b0.z = aVar35.z;
                local_b0._0_8_ = aVar35._0_8_;
                local_a0._0_8_ = local_b0._0_8_;
                local_a0.z = local_b0.z;
                aVar35 = ::operator*(&local_a0,pTStack_80[local_84].w);
                local_b8 = aVar35.z;
                c = aVar35._0_8_;
                psVar25 = (size_t *)(*(long *)(len + 10) + (ulong)local_84 * 0xc);
                *psVar25 = c;
                *(float *)(psVar25 + 1) = local_b8;
                local_90 = c;
                local_88 = local_b8;
              }
              if (pTStack_80 != (Tangent *)0x0) {
                operator_delete__(pTStack_80);
              }
            }
          }
        }
      }
      for (local_c8 = 0; uVar22 = local_c8,
          sVar21 = std::
                   vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                   ::size((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                           *)(tangents + 6)), uVar22 < sVar21 && local_c8 < 8;
          local_c8 = local_c8 + 1) {
        pvVar23 = std::
                  vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                  ::operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                *)(tangents + 6),local_c8);
        pAVar30 = glTF2::Ref<glTF2::Accessor>::operator->(pvVar23);
        if (pAVar30->count == (ulong)len[1]) {
          pvVar23 = std::
                    vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                    ::operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                  *)(tangents + 6),local_c8);
          pAVar30 = glTF2::Ref<glTF2::Accessor>::operator->(pvVar23);
          glTF2::Accessor::ExtractData<aiColor4t<float>>
                    (pAVar30,(aiColor4t<float> **)(len + local_c8 * 2 + 0xc));
        }
        else {
          pLVar26 = DefaultLogger::get();
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tc,
                         "Color stream size in mesh \"",&(pMStack_50->super_Object).name);
          std::operator+(&local_e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tc,
                         "\" does not match the vertex count");
          Logger::warn(pLVar26,&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&tc);
        }
      }
      for (local_110 = 0; uVar22 = local_110,
          sVar21 = std::
                   vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                   ::size((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                           *)&tangents[4].xyz.z), uVar22 < sVar21 && local_110 < 8;
          local_110 = local_110 + 1) {
        pvVar23 = std::
                  vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                  ::operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                *)&tangents[4].xyz.z,local_110);
        pAVar30 = glTF2::Ref<glTF2::Accessor>::operator->(pvVar23);
        if (pAVar30->count == (ulong)len[1]) {
          pvVar23 = std::
                    vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                    ::operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                  *)&tangents[4].xyz.z,local_110);
          pAVar30 = glTF2::Ref<glTF2::Accessor>::operator->(pvVar23);
          glTF2::Accessor::ExtractData<aiVector3t<float>>
                    (pAVar30,(aiVector3t<float> **)(len + local_110 * 2 + 0x1c));
          pvVar23 = std::
                    vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                    ::operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                  *)&tangents[4].xyz.z,local_110);
          pAVar30 = glTF2::Ref<glTF2::Accessor>::operator->(pvVar23);
          uVar19 = glTF2::Accessor::GetNumComponents(pAVar30);
          len[local_110 + 0x2c] = uVar19;
          lStack_158 = *(long *)(len + local_110 * 2 + 0x1c);
          for (targets._4_4_ = 0; targets._4_4_ < len[1]; targets._4_4_ = targets._4_4_ + 1) {
            *(float *)(lStack_158 + (ulong)targets._4_4_ * 0xc + 4) =
                 1.0 - *(float *)(lStack_158 + (ulong)targets._4_4_ * 0xc + 4);
          }
        }
        else {
          pLVar26 = DefaultLogger::get();
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &values,"Texcoord stream size in mesh \"",&(pMStack_50->super_Object).name)
          ;
          std::operator+(&local_130,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &values,"\" does not match the vertex count");
          Logger::warn(pLVar26,&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&values);
        }
      }
      i_2 = (size_t)&aim->mMaterialIndex;
      sVar21 = std::
               vector<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
               ::size((vector<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                       *)i_2);
      if (sVar21 != 0) {
        sVar21 = std::
                 vector<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                 ::size((vector<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                         *)i_2);
        len[0x13c] = (ai_uint32)sVar21;
        pvVar27 = operator_new__((ulong)len[0x13c] << 3);
        *(void **)(len + 0x13e) = pvVar27;
        for (aiAnimMesh = (aiAnimMesh *)0x0; paVar29 = aiAnimMesh,
            paVar28 = (aiAnimMesh *)
                      std::
                      vector<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                      ::size((vector<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                              *)i_2), paVar29 < paVar28;
            aiAnimMesh = (aiAnimMesh *)((long)&(aiAnimMesh->mName).length + 1)) {
          paVar29 = aiCreateAnimMesh((aiMesh *)len);
          *(aiAnimMesh **)(*(long *)(len + 0x13e) + (long)aiAnimMesh * 8) = paVar29;
          target = *(Target **)(*(long *)(len + 0x13e) + (long)aiAnimMesh * 8);
          positionDiff = (aiVector3D *)
                         std::
                         vector<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                         ::operator[]((vector<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                                       *)i_2,(size_type)aiAnimMesh);
          sVar21 = std::
                   vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                   ::size((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                           *)positionDiff);
          if (sVar21 != 0) {
            paStack_188 = (aiVector3t<float> *)0x0;
            pvVar23 = std::
                      vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                      ::operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                    *)positionDiff,0);
            pAVar30 = glTF2::Ref<glTF2::Accessor>::operator->(pvVar23);
            glTF2::Accessor::ExtractData<aiVector3t<float>>(pAVar30,&stack0xfffffffffffffe78);
            for (normalDiff._4_4_ = 0; normalDiff._4_4_ < len[1];
                normalDiff._4_4_ = normalDiff._4_4_ + 1) {
              aiVector3t<float>::operator+=
                        ((aiVector3t<float> *)
                         ((long)&(target[0xe].normal.
                                  super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->vector +
                         (ulong)normalDiff._4_4_ * 0xc),paStack_188 + normalDiff._4_4_);
            }
            if (paStack_188 != (aiVector3t<float> *)0x0) {
              operator_delete__(paStack_188);
            }
          }
          sVar21 = std::
                   vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                   ::size((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                           *)(positionDiff + 2));
          if (sVar21 != 0) {
            paStack_198 = (aiVector3t<float> *)0x0;
            pvVar23 = std::
                      vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                      ::operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                    *)(positionDiff + 2),0);
            pAVar30 = glTF2::Ref<glTF2::Accessor>::operator->(pvVar23);
            glTF2::Accessor::ExtractData<aiVector3t<float>>(pAVar30,&stack0xfffffffffffffe68);
            for (tangent._4_4_ = 0; tangent._4_4_ < len[1]; tangent._4_4_ = tangent._4_4_ + 1) {
              aiVector3t<float>::operator+=
                        ((aiVector3t<float> *)
                         ((long)&(target[0xe].normal.
                                  super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->vector +
                         (ulong)tangent._4_4_ * 0xc),paStack_198 + tangent._4_4_);
            }
            if (paStack_198 != (aiVector3t<float> *)0x0) {
              operator_delete__(paStack_198);
            }
          }
          sVar21 = std::
                   vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                   ::size((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                           *)(positionDiff + 4));
          if (sVar21 != 0) {
            tangentDiff = (aiVector3D *)0x0;
            pvVar23 = std::
                      vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                      ::operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                    *)(tangents + 3),0);
            pAVar30 = glTF2::Ref<glTF2::Accessor>::operator->(pvVar23);
            glTF2::Accessor::ExtractData<(anonymous_namespace)::Tangent>
                      (pAVar30,(Tangent **)&tangentDiff);
            paStack_1b0 = (aiVector3t<float> *)0x0;
            pvVar23 = std::
                      vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                      ::operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                    *)(positionDiff + 4),0);
            pAVar30 = glTF2::Ref<glTF2::Accessor>::operator->(pvVar23);
            glTF2::Accessor::ExtractData<aiVector3t<float>>(pAVar30,&stack0xfffffffffffffe50);
            for (local_1b4 = 0; local_1b4 < len[1]; local_1b4 = local_1b4 + 1) {
              aiVector3t<float>::operator+=
                        ((aiVector3t<float> *)((long)tangentDiff + (ulong)local_1b4 * 0x10),
                         paStack_1b0 + local_1b4);
              uVar22 = (ulong)local_1b4;
              pRVar3 = target[0xe].normal.
                       super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (&pRVar3->index)[uVar22 * 3] = *(uint *)((long)tangentDiff + uVar22 * 0x10 + 8);
              *(undefined8 *)((long)&pRVar3->vector + uVar22 * 0xc) =
                   *(undefined8 *)((long)tangentDiff + uVar22 * 0x10);
              aVar35 = operator^((aiVector3t<float> *)
                                 ((long)&(target[0xe].normal.
                                          super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish)->vector +
                                 (ulong)local_1b4 * 0xc),
                                 (aiVector3t<float> *)((long)tangentDiff + (ulong)local_1b4 * 0x10))
              ;
              local_1d0.z = aVar35.z;
              local_1d0._0_8_ = aVar35._0_8_;
              aVar35 = ::operator*(&local_1d0,
                                   *(float *)((long)tangentDiff + (ulong)local_1b4 * 0x10 + 0xc));
              local_1b8 = aVar35.z;
              local_1c0 = aVar35._0_8_;
              puVar31 = (undefined8 *)
                        ((long)&(target[0xe].tangent.
                                 super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->vector +
                        (ulong)local_1b4 * 0xc);
              *puVar31 = local_1c0;
              *(float *)(puVar31 + 1) = local_1b8;
            }
            if (tangentDiff != (aiVector3D *)0x0) {
              operator_delete__(tangentDiff);
            }
            if (paStack_1b0 != (aiVector3t<float> *)0x0) {
              operator_delete__(paStack_1b0);
            }
          }
          paVar29 = (aiAnimMesh *)
                    std::vector<float,_std::allocator<float>_>::size(&pMStack_50->weights);
          if (aiAnimMesh < paVar29) {
            pvVar32 = std::vector<float,_std::allocator<float>_>::operator[]
                                (&pMStack_50->weights,(size_type)aiAnimMesh);
            *(value_type *)
             ((long)&target[0x10].normal.
                     super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = *pvVar32;
          }
        }
      }
      nFaces = 0;
      count = 0;
      bVar17 = glTF2::Ref::operator_cast_to_bool((Ref *)(aim->mNumUVComponents + 6));
      if (bVar17) {
        pAVar30 = glTF2::Ref<glTF2::Accessor>::operator->
                            ((Ref<glTF2::Accessor> *)(aim->mNumUVComponents + 6));
        data.stride = pAVar30->count;
        pAVar30 = glTF2::Ref<glTF2::Accessor>::operator->
                            ((Ref<glTF2::Accessor> *)(aim->mNumUVComponents + 6));
        glTF2::Accessor::GetIndexer((Indexer *)&i_4,pAVar30);
        bVar17 = glTF2::Accessor::Indexer::IsValid((Indexer *)&i_4);
        sVar16 = data.stride;
        if (!bVar17) {
          __assert_fail("data.IsValid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/glTF2/glTF2Importer.cpp"
                        ,0x207,"void Assimp::glTF2Importer::ImportMeshes(glTF2::Asset &)");
        }
        switch(aim->mPrimitiveTypes) {
        case 0:
          count = data.stride;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = data.stride;
          uVar22 = SUB168(auVar4 * ZEXT816(0x10),0);
          uVar34 = uVar22 + 8;
          if (0xfffffffffffffff7 < uVar22) {
            uVar34 = 0xffffffffffffffff;
          }
          if (SUB168(auVar4 * ZEXT816(0x10),8) != 0) {
            uVar34 = 0xffffffffffffffff;
          }
          psVar25 = (size_t *)operator_new__(uVar34);
          *psVar25 = sVar16;
          nFaces = (size_t)(psVar25 + 1);
          if (sVar16 != 0) {
            local_4a8 = (aiFace *)nFaces;
            do {
              aiFace::aiFace(local_4a8);
              local_4a8 = local_4a8 + 1;
            } while (local_4a8 != (aiFace *)(nFaces + sVar16 * 0x10));
          }
          for (i_5 = 0; i_5 < data.stride; i_5 = i_5 + 1) {
            uVar19 = glTF2::Accessor::Indexer::GetUInt((Indexer *)&i_4,i_5);
            SetFace((aiFace *)(nFaces + (ulong)i_5 * 0x10),uVar19);
          }
          break;
        case 1:
          count = data.stride >> 1;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = count;
          uVar22 = SUB168(auVar5 * ZEXT816(0x10),0);
          uVar34 = uVar22 + 8;
          if (0xfffffffffffffff7 < uVar22) {
            uVar34 = 0xffffffffffffffff;
          }
          if (SUB168(auVar5 * ZEXT816(0x10),8) != 0) {
            uVar34 = 0xffffffffffffffff;
          }
          puVar33 = (ulong *)operator_new__(uVar34);
          *puVar33 = count;
          nFaces = (size_t)(puVar33 + 1);
          if (count != 0) {
            local_4e8 = (aiFace *)nFaces;
            do {
              aiFace::aiFace(local_4e8);
              local_4e8 = local_4e8 + 1;
            } while (local_4e8 != (aiFace *)(nFaces + count * 0x10));
          }
          for (i_6 = 0; i_6 < data.stride; i_6 = i_6 + 2) {
            uVar19 = glTF2::Accessor::Indexer::GetUInt((Indexer *)&i_4,i_6);
            uVar18 = glTF2::Accessor::Indexer::GetUInt((Indexer *)&i_4,i_6 + 1);
            SetFace((aiFace *)(nFaces + (ulong)(i_6 >> 1) * 0x10),uVar19,uVar18);
          }
          break;
        case 2:
        case 3:
          count = data.stride - (aim->mPrimitiveTypes == 3);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = count;
          uVar22 = SUB168(auVar6 * ZEXT816(0x10),0);
          uVar34 = uVar22 + 8;
          if (0xfffffffffffffff7 < uVar22) {
            uVar34 = 0xffffffffffffffff;
          }
          if (SUB168(auVar6 * ZEXT816(0x10),8) != 0) {
            uVar34 = 0xffffffffffffffff;
          }
          puVar33 = (ulong *)operator_new__(uVar34);
          *puVar33 = count;
          nFaces = (size_t)(puVar33 + 1);
          if (count != 0) {
            local_530 = (aiFace *)nFaces;
            do {
              aiFace::aiFace(local_530);
              local_530 = local_530 + 1;
            } while (local_530 != (aiFace *)(nFaces + count * 0x10));
          }
          uVar19 = glTF2::Accessor::Indexer::GetUInt((Indexer *)&i_4,0);
          uVar18 = glTF2::Accessor::Indexer::GetUInt((Indexer *)&i_4,1);
          SetFace((aiFace *)nFaces,uVar19,uVar18);
          for (i_7 = 2; i_7 < data.stride; i_7 = i_7 + 1) {
            iVar1 = *(int *)(puVar33[(ulong)(i_7 - 2) * 2 + 2] + 4);
            uVar19 = glTF2::Accessor::Indexer::GetUInt((Indexer *)&i_4,i_7);
            SetFace((aiFace *)(nFaces + (ulong)(i_7 - 1) * 0x10),iVar1,uVar19);
          }
          if (aim->mPrimitiveTypes == 2) {
            SetFace((aiFace *)(nFaces + (data.stride - 1) * 0x10),
                    ((aiFace *)(nFaces + (data.stride - 2) * 0x10))->mIndices[1],*(int *)puVar33[2])
            ;
          }
          break;
        case 4:
          count = data.stride / 3;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = count;
          uVar22 = SUB168(auVar7 * ZEXT816(0x10),0);
          uVar34 = uVar22 + 8;
          if (0xfffffffffffffff7 < uVar22) {
            uVar34 = 0xffffffffffffffff;
          }
          if (SUB168(auVar7 * ZEXT816(0x10),8) != 0) {
            uVar34 = 0xffffffffffffffff;
          }
          puVar33 = (ulong *)operator_new__(uVar34);
          *puVar33 = count;
          nFaces = (size_t)(puVar33 + 1);
          if (count != 0) {
            local_588 = (aiFace *)nFaces;
            do {
              aiFace::aiFace(local_588);
              local_588 = local_588 + 1;
            } while (local_588 != (aiFace *)(nFaces + count * 0x10));
          }
          for (i_8 = 0; i_8 < data.stride; i_8 = i_8 + 3) {
            uVar19 = glTF2::Accessor::Indexer::GetUInt((Indexer *)&i_4,i_8);
            uVar18 = glTF2::Accessor::Indexer::GetUInt((Indexer *)&i_4,i_8 + 1);
            uVar20 = glTF2::Accessor::Indexer::GetUInt((Indexer *)&i_4,i_8 + 2);
            SetFace((aiFace *)
                    ((long)&((aiFace *)nFaces)->mNumIndices +
                    ((ulong)i_8 * 0xaaaaaaab >> 0x1d & 0xfffffffffffffff0)),uVar19,uVar18,uVar20);
          }
          break;
        case 5:
          count = data.stride - 2;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = count;
          uVar22 = SUB168(auVar8 * ZEXT816(0x10),0);
          uVar34 = uVar22 + 8;
          if (0xfffffffffffffff7 < uVar22) {
            uVar34 = 0xffffffffffffffff;
          }
          if (SUB168(auVar8 * ZEXT816(0x10),8) != 0) {
            uVar34 = 0xffffffffffffffff;
          }
          puVar33 = (ulong *)operator_new__(uVar34);
          *puVar33 = count;
          nFaces = (size_t)(puVar33 + 1);
          if (count != 0) {
            local_5d0 = (aiFace *)nFaces;
            do {
              aiFace::aiFace(local_5d0);
              local_5d0 = local_5d0 + 1;
            } while (local_5d0 != (aiFace *)(nFaces + count * 0x10));
          }
          for (count_1 = 0; count_1 < count; count_1 = count_1 + 1) {
            if ((count_1 + 1 & 1) == 0) {
              uVar19 = glTF2::Accessor::Indexer::GetUInt((Indexer *)&i_4,count_1 + 1);
              uVar18 = glTF2::Accessor::Indexer::GetUInt((Indexer *)&i_4,count_1);
              uVar20 = glTF2::Accessor::Indexer::GetUInt((Indexer *)&i_4,count_1 + 2);
              SetFace((aiFace *)(nFaces + (ulong)count_1 * 0x10),uVar19,uVar18,uVar20);
            }
            else {
              uVar19 = glTF2::Accessor::Indexer::GetUInt((Indexer *)&i_4,count_1);
              uVar18 = glTF2::Accessor::Indexer::GetUInt((Indexer *)&i_4,count_1 + 1);
              uVar20 = glTF2::Accessor::Indexer::GetUInt((Indexer *)&i_4,count_1 + 2);
              SetFace((aiFace *)(nFaces + (ulong)count_1 * 0x10),uVar19,uVar18,uVar20);
            }
          }
          break;
        case 6:
          count = data.stride - 2;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = count;
          uVar22 = SUB168(auVar9 * ZEXT816(0x10),0);
          uVar34 = uVar22 + 8;
          if (0xfffffffffffffff7 < uVar22) {
            uVar34 = 0xffffffffffffffff;
          }
          if (SUB168(auVar9 * ZEXT816(0x10),8) != 0) {
            uVar34 = 0xffffffffffffffff;
          }
          puVar33 = (ulong *)operator_new__(uVar34);
          *puVar33 = count;
          nFaces = (size_t)(puVar33 + 1);
          if (count != 0) {
            local_630 = (aiFace *)nFaces;
            do {
              aiFace::aiFace(local_630);
              local_630 = local_630 + 1;
            } while (local_630 != (aiFace *)(nFaces + count * 0x10));
          }
          uVar19 = glTF2::Accessor::Indexer::GetUInt((Indexer *)&i_4,0);
          uVar18 = glTF2::Accessor::Indexer::GetUInt((Indexer *)&i_4,1);
          uVar20 = glTF2::Accessor::Indexer::GetUInt((Indexer *)&i_4,2);
          SetFace((aiFace *)nFaces,uVar19,uVar18,uVar20);
          for (i_9 = 1; i_9 < count; i_9 = i_9 + 1) {
            iVar1 = *(int *)puVar33[2];
            b = *(int *)(puVar33[(ulong)(i_9 - 1) * 2 + 2] + 8);
            uVar19 = glTF2::Accessor::Indexer::GetUInt((Indexer *)&i_4,i_9 + 2);
            SetFace((aiFace *)(nFaces + (ulong)i_9 * 0x10),iVar1,b,uVar19);
          }
        }
      }
      else {
        uVar19 = len[1];
        switch(aim->mPrimitiveTypes) {
        case 0:
          count = CONCAT44(0,uVar19);
          auVar10._8_8_ = 0;
          auVar10._0_8_ = count;
          uVar22 = SUB168(auVar10 * ZEXT816(0x10),0);
          uVar34 = uVar22 + 8;
          if (0xfffffffffffffff7 < uVar22) {
            uVar34 = 0xffffffffffffffff;
          }
          if (SUB168(auVar10 * ZEXT816(0x10),8) != 0) {
            uVar34 = 0xffffffffffffffff;
          }
          puVar33 = (ulong *)operator_new__(uVar34);
          *puVar33 = count;
          nFaces = (size_t)(puVar33 + 1);
          if (count != 0) {
            local_698 = (aiFace *)nFaces;
            do {
              aiFace::aiFace(local_698);
              local_698 = local_698 + 1;
            } while (local_698 != (aiFace *)(nFaces + count * 0x10));
          }
          for (i_11 = 0; i_11 < uVar19; i_11 = i_11 + 1) {
            SetFace((aiFace *)(nFaces + (ulong)i_11 * 0x10),i_11);
          }
          break;
        case 1:
          count = CONCAT44(0,uVar19 >> 1);
          auVar11._8_8_ = 0;
          auVar11._0_8_ = count;
          uVar22 = SUB168(auVar11 * ZEXT816(0x10),0);
          uVar34 = uVar22 + 8;
          if (0xfffffffffffffff7 < uVar22) {
            uVar34 = 0xffffffffffffffff;
          }
          if (SUB168(auVar11 * ZEXT816(0x10),8) != 0) {
            uVar34 = 0xffffffffffffffff;
          }
          puVar33 = (ulong *)operator_new__(uVar34);
          *puVar33 = count;
          nFaces = (size_t)(puVar33 + 1);
          if (count != 0) {
            local_6c8 = (aiFace *)nFaces;
            do {
              aiFace::aiFace(local_6c8);
              local_6c8 = local_6c8 + 1;
            } while (local_6c8 != (aiFace *)(nFaces + count * 0x10));
          }
          for (i_12 = 0; i_12 < uVar19; i_12 = i_12 + 2) {
            SetFace((aiFace *)(nFaces + (ulong)(i_12 >> 1) * 0x10),i_12,i_12 + 1);
          }
          break;
        case 2:
        case 3:
          count = CONCAT44(0,uVar19 - (aim->mPrimitiveTypes == 3));
          auVar12._8_8_ = 0;
          auVar12._0_8_ = count;
          uVar22 = SUB168(auVar12 * ZEXT816(0x10),0);
          uVar34 = uVar22 + 8;
          if (0xfffffffffffffff7 < uVar22) {
            uVar34 = 0xffffffffffffffff;
          }
          if (SUB168(auVar12 * ZEXT816(0x10),8) != 0) {
            uVar34 = 0xffffffffffffffff;
          }
          puVar33 = (ulong *)operator_new__(uVar34);
          *puVar33 = count;
          nFaces = (size_t)(puVar33 + 1);
          if (count != 0) {
            local_6f8 = (aiFace *)nFaces;
            do {
              aiFace::aiFace(local_6f8);
              local_6f8 = local_6f8 + 1;
            } while (local_6f8 != (aiFace *)(nFaces + count * 0x10));
          }
          SetFace((aiFace *)nFaces,0,1);
          for (i_13 = 2; i_13 < uVar19; i_13 = i_13 + 1) {
            SetFace((aiFace *)(nFaces + (ulong)(i_13 - 1) * 0x10),
                    *(int *)(puVar33[(ulong)(i_13 - 2) * 2 + 2] + 4),i_13);
          }
          if (aim->mPrimitiveTypes == 2) {
            SetFace((aiFace *)(nFaces + (ulong)(uVar19 - 1) * 0x10),
                    *(int *)(puVar33[(ulong)(uVar19 - 2) * 2 + 2] + 4),*(int *)puVar33[2]);
          }
          break;
        case 4:
          count = (ulong)uVar19 / 3;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = count;
          uVar22 = SUB168(auVar13 * ZEXT816(0x10),0);
          uVar34 = uVar22 + 8;
          if (0xfffffffffffffff7 < uVar22) {
            uVar34 = 0xffffffffffffffff;
          }
          if (SUB168(auVar13 * ZEXT816(0x10),8) != 0) {
            uVar34 = 0xffffffffffffffff;
          }
          puVar33 = (ulong *)operator_new__(uVar34);
          *puVar33 = count;
          nFaces = (size_t)(puVar33 + 1);
          if (count != 0) {
            local_728 = (aiFace *)nFaces;
            do {
              aiFace::aiFace(local_728);
              local_728 = local_728 + 1;
            } while (local_728 != (aiFace *)(nFaces + count * 0x10));
          }
          for (i_14 = 0; i_14 < uVar19; i_14 = i_14 + 3) {
            SetFace((aiFace *)
                    ((long)&((aiFace *)nFaces)->mNumIndices +
                    ((ulong)i_14 * 0xaaaaaaab >> 0x1d & 0xfffffffffffffff0)),i_14,i_14 + 1,i_14 + 2)
            ;
          }
          break;
        case 5:
          count = CONCAT44(0,uVar19 - 2);
          auVar14._8_8_ = 0;
          auVar14._0_8_ = count;
          uVar22 = SUB168(auVar14 * ZEXT816(0x10),0);
          uVar34 = uVar22 + 8;
          if (0xfffffffffffffff7 < uVar22) {
            uVar34 = 0xffffffffffffffff;
          }
          if (SUB168(auVar14 * ZEXT816(0x10),8) != 0) {
            uVar34 = 0xffffffffffffffff;
          }
          puVar33 = (ulong *)operator_new__(uVar34);
          *puVar33 = count;
          nFaces = (size_t)(puVar33 + 1);
          if (count != 0) {
            local_758 = (aiFace *)nFaces;
            do {
              aiFace::aiFace(local_758);
              local_758 = local_758 + 1;
            } while (local_758 != (aiFace *)(nFaces + count * 0x10));
          }
          for (local_258 = 0; local_258 < count; local_258 = local_258 + 1) {
            if ((local_258 + 1 & 1) == 0) {
              SetFace((aiFace *)(nFaces + (ulong)local_258 * 0x10),local_258 + 1,local_258,
                      local_258 + 2);
            }
            else {
              SetFace((aiFace *)(nFaces + (ulong)local_258 * 0x10),local_258,local_258 + 1,
                      local_258 + 2);
            }
          }
          break;
        case 6:
          count = CONCAT44(0,uVar19 - 2);
          auVar15._8_8_ = 0;
          auVar15._0_8_ = count;
          uVar22 = SUB168(auVar15 * ZEXT816(0x10),0);
          uVar34 = uVar22 + 8;
          if (0xfffffffffffffff7 < uVar22) {
            uVar34 = 0xffffffffffffffff;
          }
          if (SUB168(auVar15 * ZEXT816(0x10),8) != 0) {
            uVar34 = 0xffffffffffffffff;
          }
          puVar33 = (ulong *)operator_new__(uVar34);
          *puVar33 = count;
          nFaces = (size_t)(puVar33 + 1);
          if (count != 0) {
            local_788 = (aiFace *)nFaces;
            do {
              aiFace::aiFace(local_788);
              local_788 = local_788 + 1;
            } while (local_788 != (aiFace *)(nFaces + count * 0x10));
          }
          SetFace((aiFace *)nFaces,0,1,2);
          for (local_25c = 1; local_25c < count; local_25c = local_25c + 1) {
            SetFace((aiFace *)(nFaces + (ulong)local_25c * 0x10),*(int *)puVar33[2],
                    *(int *)(puVar33[(ulong)(local_25c - 1) * 2 + 2] + 8),local_25c + 2);
          }
        }
      }
      if (nFaces != 0) {
        *(size_t *)(len + 0x34) = nFaces;
        len[2] = (uint)count;
        bVar17 = CheckValidFacesIndices((aiFace *)nFaces,(uint)count,len[1]);
        if (!bVar17) {
          __assert_fail("CheckValidFacesIndices(faces, static_cast<unsigned>(nFaces), aim->mNumVertices)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/glTF2/glTF2Importer.cpp"
                        ,0x29c,"void Assimp::glTF2Importer::ImportMeshes(glTF2::Asset &)");
        }
      }
      bVar17 = glTF2::Ref::operator_cast_to_bool((Ref *)&aim->mNumBones);
      if (bVar17) {
        uVar19 = glTF2::Ref<glTF2::Material>::GetIndex((Ref<glTF2::Material> *)&aim->mNumBones);
        len[0x3a] = uVar19;
      }
      else {
        len[0x3a] = this->mScene->mNumMaterials - 1;
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void glTF2Importer::ImportMeshes(glTF2::Asset& r)
{
    std::vector<aiMesh*> meshes;

    unsigned int k = 0;

    for (unsigned int m = 0; m < r.meshes.Size(); ++m) {
        Mesh& mesh = r.meshes[m];

        meshOffsets.push_back(k);
        k += unsigned(mesh.primitives.size());

        for (unsigned int p = 0; p < mesh.primitives.size(); ++p) {
            Mesh::Primitive& prim = mesh.primitives[p];

            aiMesh* aim = new aiMesh();
            meshes.push_back(aim);

            aim->mName = mesh.name.empty() ? mesh.id : mesh.name;

            if (mesh.primitives.size() > 1) {
                ai_uint32& len = aim->mName.length;
                aim->mName.data[len] = '-';
                len += 1 + ASSIMP_itoa10(aim->mName.data + len + 1, unsigned(MAXLEN - len - 1), p);
            }

            switch (prim.mode) {
                case PrimitiveMode_POINTS:
                    aim->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;

                case PrimitiveMode_LINES:
                case PrimitiveMode_LINE_LOOP:
                case PrimitiveMode_LINE_STRIP:
                    aim->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;

                case PrimitiveMode_TRIANGLES:
                case PrimitiveMode_TRIANGLE_STRIP:
                case PrimitiveMode_TRIANGLE_FAN:
                    aim->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;

            }

            Mesh::Primitive::Attributes& attr = prim.attributes;

            if (attr.position.size() > 0 && attr.position[0]) {
                aim->mNumVertices = static_cast<unsigned int>(attr.position[0]->count);
                attr.position[0]->ExtractData(aim->mVertices);
            }

            if (attr.normal.size() > 0 && attr.normal[0]) {
                attr.normal[0]->ExtractData(aim->mNormals);

                // only extract tangents if normals are present
                if (attr.tangent.size() > 0 && attr.tangent[0]) {
                    // generate bitangents from normals and tangents according to spec
                    Tangent *tangents = nullptr;

                    attr.tangent[0]->ExtractData(tangents);

                    aim->mTangents = new aiVector3D[aim->mNumVertices];
                    aim->mBitangents = new aiVector3D[aim->mNumVertices];

                    for (unsigned int i = 0; i < aim->mNumVertices; ++i) {
                        aim->mTangents[i] = tangents[i].xyz;
                        aim->mBitangents[i] = (aim->mNormals[i] ^ tangents[i].xyz) * tangents[i].w;
                    }

                    delete [] tangents;
                }
            }

            for (size_t c = 0; c < attr.color.size() && c < AI_MAX_NUMBER_OF_COLOR_SETS; ++c) {
                if (attr.color[c]->count != aim->mNumVertices) {
                    DefaultLogger::get()->warn("Color stream size in mesh \"" + mesh.name +
                        "\" does not match the vertex count");
                    continue;
                }
                attr.color[c]->ExtractData(aim->mColors[c]);
            }
            for (size_t tc = 0; tc < attr.texcoord.size() && tc < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++tc) {
                if (attr.texcoord[tc]->count != aim->mNumVertices) {
                    DefaultLogger::get()->warn("Texcoord stream size in mesh \"" + mesh.name +
                                               "\" does not match the vertex count");
                    continue;
                }

                attr.texcoord[tc]->ExtractData(aim->mTextureCoords[tc]);
                aim->mNumUVComponents[tc] = attr.texcoord[tc]->GetNumComponents();

                aiVector3D* values = aim->mTextureCoords[tc];
                for (unsigned int i = 0; i < aim->mNumVertices; ++i) {
                    values[i].y = 1 - values[i].y; // Flip Y coords
                }
            }

            std::vector<Mesh::Primitive::Target>& targets = prim.targets;
            if (targets.size() > 0) {
                aim->mNumAnimMeshes = (unsigned int)targets.size();
                aim->mAnimMeshes = new aiAnimMesh*[aim->mNumAnimMeshes];
                for (size_t i = 0; i < targets.size(); i++) {
                    aim->mAnimMeshes[i] = aiCreateAnimMesh(aim);
                    aiAnimMesh& aiAnimMesh = *(aim->mAnimMeshes[i]);
                    Mesh::Primitive::Target& target = targets[i];

                    if (target.position.size() > 0) {
                        aiVector3D *positionDiff = nullptr;
                        target.position[0]->ExtractData(positionDiff);
                        for(unsigned int vertexId = 0; vertexId < aim->mNumVertices; vertexId++) {
                            aiAnimMesh.mVertices[vertexId] += positionDiff[vertexId];
                        }
                        delete [] positionDiff;
                    }
                    if (target.normal.size() > 0) {
                        aiVector3D *normalDiff = nullptr;
                        target.normal[0]->ExtractData(normalDiff);
                        for(unsigned int vertexId = 0; vertexId < aim->mNumVertices; vertexId++) {
                            aiAnimMesh.mNormals[vertexId] += normalDiff[vertexId];
                        }
                        delete [] normalDiff;
                    }
                    if (target.tangent.size() > 0) {
                        Tangent *tangent = nullptr;
                        attr.tangent[0]->ExtractData(tangent);

                        aiVector3D *tangentDiff = nullptr;
                        target.tangent[0]->ExtractData(tangentDiff);

                        for (unsigned int vertexId = 0; vertexId < aim->mNumVertices; ++vertexId) {
                            tangent[vertexId].xyz += tangentDiff[vertexId];
                            aiAnimMesh.mTangents[vertexId] = tangent[vertexId].xyz;
                            aiAnimMesh.mBitangents[vertexId] = (aiAnimMesh.mNormals[vertexId] ^ tangent[vertexId].xyz) * tangent[vertexId].w;
                        }
                        delete [] tangent;
                        delete [] tangentDiff;
                    }
                    if (mesh.weights.size() > i) {
                        aiAnimMesh.mWeight = mesh.weights[i];
                    }
                }
            }


            aiFace* faces = 0;
            size_t nFaces = 0;

            if (prim.indices) {
                size_t count = prim.indices->count;

                Accessor::Indexer data = prim.indices->GetIndexer();
                ai_assert(data.IsValid());

                switch (prim.mode) {
                    case PrimitiveMode_POINTS: {
                        nFaces = count;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; ++i) {
                            SetFace(faces[i], data.GetUInt(i));
                        }
                        break;
                    }

                    case PrimitiveMode_LINES: {
                        nFaces = count / 2;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; i += 2) {
                            SetFace(faces[i / 2], data.GetUInt(i), data.GetUInt(i + 1));
                        }
                        break;
                    }

                    case PrimitiveMode_LINE_LOOP:
                    case PrimitiveMode_LINE_STRIP: {
                        nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1));
                        for (unsigned int i = 2; i < count; ++i) {
                            SetFace(faces[i - 1], faces[i - 2].mIndices[1], data.GetUInt(i));
                        }
                        if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
                            SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
                        }
                        break;
                    }

                    case PrimitiveMode_TRIANGLES: {
                        nFaces = count / 3;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; i += 3) {
                            SetFace(faces[i / 3], data.GetUInt(i), data.GetUInt(i + 1), data.GetUInt(i + 2));
                        }
                        break;
                    }
                    case PrimitiveMode_TRIANGLE_STRIP: {
                        nFaces = count - 2;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < nFaces; ++i) {
                            //The ordering is to ensure that the triangles are all drawn with the same orientation
                            if ((i + 1) % 2 == 0)
                            {
                                //For even n, vertices n + 1, n, and n + 2 define triangle n
                                SetFace(faces[i], data.GetUInt(i + 1), data.GetUInt(i), data.GetUInt(i + 2));
                            }
                            else
                            {
                                //For odd n, vertices n, n+1, and n+2 define triangle n
                                SetFace(faces[i], data.GetUInt(i), data.GetUInt(i + 1), data.GetUInt(i + 2));
                            }
                        }
                        break;
                    }
                    case PrimitiveMode_TRIANGLE_FAN:
                        nFaces = count - 2;
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1), data.GetUInt(2));
                        for (unsigned int i = 1; i < nFaces; ++i) {
                            SetFace(faces[i], faces[0].mIndices[0], faces[i - 1].mIndices[2], data.GetUInt(i + 2));
                        }
                        break;
                }
            }
            else { // no indices provided so directly generate from counts

                // use the already determined count as it includes checks
                unsigned int count = aim->mNumVertices;

                switch (prim.mode) {
                case PrimitiveMode_POINTS: {
                    nFaces = count;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; ++i) {
                        SetFace(faces[i], i);
                    }
                    break;
                }

                case PrimitiveMode_LINES: {
                    nFaces = count / 2;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; i += 2) {
                        SetFace(faces[i / 2], i, i + 1);
                    }
                    break;
                }

                case PrimitiveMode_LINE_LOOP:
                case PrimitiveMode_LINE_STRIP: {
                    nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1);
                    for (unsigned int i = 2; i < count; ++i) {
                        SetFace(faces[i - 1], faces[i - 2].mIndices[1], i);
                    }
                    if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
                        SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
                    }
                    break;
                }

                case PrimitiveMode_TRIANGLES: {
                    nFaces = count / 3;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; i += 3) {
                        SetFace(faces[i / 3], i, i + 1, i + 2);
                    }
                    break;
                }
                case PrimitiveMode_TRIANGLE_STRIP: {
                    nFaces = count - 2;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < nFaces; ++i) {
                        //The ordering is to ensure that the triangles are all drawn with the same orientation
                        if ((i+1) % 2 == 0)
                        {
                            //For even n, vertices n + 1, n, and n + 2 define triangle n
                            SetFace(faces[i], i+1, i, i+2);
                        }
                        else
                        {
                            //For odd n, vertices n, n+1, and n+2 define triangle n
                            SetFace(faces[i], i, i+1, i+2);
                        }
                    }
                    break;
                }
                case PrimitiveMode_TRIANGLE_FAN:
                    nFaces = count - 2;
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1, 2);
                    for (unsigned int i = 1; i < nFaces; ++i) {
                        SetFace(faces[i], faces[0].mIndices[0], faces[i - 1].mIndices[2], i + 2);
                    }
                    break;
                }
            }

            if (faces) {
                aim->mFaces = faces;
                aim->mNumFaces = static_cast<unsigned int>(nFaces);
                ai_assert(CheckValidFacesIndices(faces, static_cast<unsigned>(nFaces), aim->mNumVertices));
            }

            if (prim.material) {
                aim->mMaterialIndex = prim.material.GetIndex();
            }
            else {
                aim->mMaterialIndex = mScene->mNumMaterials - 1;
            }

        }
    }

    meshOffsets.push_back(k);

    CopyVector(meshes, mScene->mMeshes, mScene->mNumMeshes);
}